

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::loop(Connection *this)

{
  long *plVar1;
  RequestConnectOrProtocolError *requestOrProtocolError;
  bool bVar2;
  byte extraout_AL;
  byte extraout_AL_00;
  LoopResult LVar3;
  undefined8 *puVar4;
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *promise;
  Promise<kj::HttpServer::Connection::LoopResult> *promise_00;
  byte *pbVar5;
  HttpInputStreamImpl *this_01;
  Promise<void> *other;
  Promise<void> *this_02;
  ForkedPromise<void> *this_03;
  Promise<void> *this_04;
  Promise<bool> *this_05;
  Promise<bool> *this_06;
  Promise<void> *this_07;
  Promise<void> *this_08;
  Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *this_09;
  OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
  *__return_storage_ptr__;
  PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr___00;
  LoopResult *pLVar6;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr___01;
  Connection *this_10;
  undefined8 in_RSI;
  void *pvVar7;
  undefined4 in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a4;
  int local_928;
  int local_8b8;
  Connection *this_local;
  
  puVar4 = (undefined8 *)operator_new(0x730);
  *puVar4 = loop;
  puVar4[1] = loop;
  pbVar5 = (byte *)((long)puVar4 + 0x72e);
  this_01 = (HttpInputStreamImpl *)(puVar4 + 0xd4);
  other = (Promise<void> *)(puVar4 + 0xd5);
  this_02 = (Promise<void> *)(puVar4 + 0xd6);
  this_03 = (ForkedPromise<void> *)(puVar4 + 0xd7);
  this_04 = (Promise<void> *)(puVar4 + 0xd9);
  this_05 = (Promise<bool> *)(puVar4 + 0xda);
  this_06 = (Promise<bool> *)(puVar4 + 0xdd);
  this_07 = (Promise<void> *)(puVar4 + 0xde);
  this_08 = (Promise<void> *)(puVar4 + 0xdf);
  this_09 = (Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
             *)(puVar4 + 0xe1);
  __return_storage_ptr__ =
       (OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
        *)(puVar4 + 0xbd);
  __return_storage_ptr___00 =
       (PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
        *)(puVar4 + 0x47);
  pLVar6 = (LoopResult *)((long)puVar4 + 0x724);
  __return_storage_ptr___01 =
       (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)(puVar4 + 0x86);
  this_10 = (Connection *)(puVar4 + 0xe2);
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)(puVar4 + 2);
  puVar4[0xe3] = in_RSI;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar4 + 0xc5),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"loop",0x1d3c,0x1b);
  pvVar7 = (void *)puVar4[199];
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::Coroutine
            (this_00,*(SourceLocation *)(puVar4 + 0xc5));
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::get_return_object
            ((Coroutine<kj::HttpServer::Connection::LoopResult> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar2 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar4 + 0x72d));
  if (bVar2) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar4 + 0x72d));
    *pbVar5 = 1;
    do {
      if ((((*pbVar5 & 1) == 0) && ((*(byte *)(*(long *)(puVar4[0xe3] + 0x18) + 0x70) & 1) != 0)) &&
         (bVar2 = anon_unknown_36::HttpInputStreamImpl::isCleanDrain
                            ((HttpInputStreamImpl *)(puVar4[0xe3] + 0x38)), bVar2)) {
        kj::_::
        CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
        ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                        *)this_00,BREAK_LOOP_CONN_OK);
        local_8b8 = 3;
        goto LAB_0072a7f4;
      }
      anon_unknown_36::HttpInputStreamImpl::awaitNextMessage(this_01);
      if ((*pbVar5 & 1) == 0) {
        plVar1 = *(long **)(*(long *)(puVar4[0xe3] + 0x18) + 8);
        (**(code **)(*plVar1 + 0x10))
                  (other,plVar1,*(undefined8 *)(*(long *)(puVar4[0xe3] + 0x18) + 0x38));
        bVar2 = anon_unknown_36::HttpInputStreamImpl::isCleanDrain
                          ((HttpInputStreamImpl *)(puVar4[0xe3] + 0x38));
        if (bVar2) {
          ForkedPromise<void>::addBranch(this_03);
          puVar4[0xd8] = puVar4[0xe3];
          Promise<void>::then<kj::HttpServer::Connection::loop()::_lambda()_1_>
                    (this_02,(Type *)this_03);
          Promise<void>::~Promise((Promise<void> *)this_03);
          mv<kj::Promise<void>>(this_02);
          SourceLocation::SourceLocation
                    ((SourceLocation *)(puVar4 + 200),
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,"loop",0x1d69,0x1c);
          Promise<void>::exclusiveJoin(this_04,other,*(SourceLocation *)(puVar4 + 200));
          Promise<void>::operator=(other,this_04);
          Promise<void>::~Promise(this_04);
          Promise<void>::~Promise(this_02);
        }
        puVar4[0xdc] = puVar4[0xe3];
        Promise<void>::then<kj::HttpServer::Connection::loop()::_lambda()_2_>
                  ((Promise<void> *)(puVar4 + 0xdb),(Type *)other);
        SourceLocation::SourceLocation
                  ((SourceLocation *)(puVar4 + 0xcb),
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,"loop",0x1d6c,0x15);
        pvVar7 = (void *)puVar4[0xcd];
        Promise<bool>::exclusiveJoin
                  (this_05,(Promise<bool> *)this_01,*(SourceLocation *)(puVar4 + 0xcb));
        Promise<bool>::operator=((Promise<bool> *)this_01,this_05);
        Promise<bool>::~Promise(this_05);
        Promise<bool>::~Promise((Promise<bool> *)(puVar4 + 0xdb));
        Promise<void>::~Promise(other);
      }
      puVar4[0xd1] = puVar4[0xe3];
      *(byte *)(puVar4 + 0xd2) = *pbVar5 & 1;
      Promise<bool>::then<kj::HttpServer::Connection::loop()::_lambda(bool)_1_>
                (this_06,(Type *)this_01);
      if ((*pbVar5 & 1) != 0) {
        plVar1 = *(long **)(*(long *)(puVar4[0xe3] + 0x18) + 8);
        (**(code **)(*plVar1 + 0x10))
                  (this_08,plVar1,*(undefined8 *)(*(long *)(puVar4[0xe3] + 0x18) + 0x30));
        puVar4[0xe0] = puVar4[0xe3];
        Promise<void>::then<kj::HttpServer::Connection::loop()::_lambda()_3_>
                  (this_07,(Type *)this_08);
        Promise<void>::~Promise(this_08);
        mv<kj::Promise<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>>
                  ((Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                    *)this_07);
        SourceLocation::SourceLocation
                  ((SourceLocation *)(puVar4 + 0xce),
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,"loop",0x1d9e,0x1b);
        pvVar7 = (void *)puVar4[0xd0];
        Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
        ::exclusiveJoin(this_09,(Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                                 *)this_06,*(SourceLocation *)(puVar4 + 0xce));
        Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
        ::operator=((Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                     *)this_06,this_09);
        Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
        ::~Promise(this_09);
        Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
        ::~Promise((Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                    *)this_07);
      }
      promise = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                await_transform<kj::Promise<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>&>
                          (this_00,(Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                                    *)this_06);
      co_await<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>
                (__return_storage_ptr___00,promise);
      bVar2 = kj::_::PromiseAwaiterBase::await_ready
                        ((PromiseAwaiterBase *)__return_storage_ptr___00);
      if (!bVar2) {
        *(undefined1 *)((long)puVar4 + 0x72c) = 1;
        loop((void *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),pvVar7);
        if ((extraout_AL & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      kj::_::
      PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
      ::await_resume(__return_storage_ptr__,__return_storage_ptr___00);
      kj::_::
      PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
      ::~PromiseAwaiter(__return_storage_ptr___00);
      requestOrProtocolError = (RequestConnectOrProtocolError *)puVar4[0xe3];
      mv<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>
                (__return_storage_ptr__);
      onHeaders(this_10,requestOrProtocolError);
      promise_00 = kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
                   await_transform<kj::Promise<kj::HttpServer::Connection::LoopResult>>
                             (this_00,(Promise<kj::HttpServer::Connection::LoopResult> *)this_10);
      co_await<kj::HttpServer::Connection::LoopResult>(__return_storage_ptr___01,promise_00);
      bVar2 = kj::_::PromiseAwaiterBase::await_ready
                        ((PromiseAwaiterBase *)__return_storage_ptr___01);
      if (!bVar2) {
        *(undefined1 *)((long)puVar4 + 0x72c) = 2;
        loop((void *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),pvVar7);
        if ((extraout_AL_00 & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      LVar3 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                        (__return_storage_ptr___01);
      *(LoopResult *)(puVar4 + 0xe5) = LVar3;
      kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter
                (__return_storage_ptr___01);
      Promise<kj::HttpServer::Connection::LoopResult>::~Promise
                ((Promise<kj::HttpServer::Connection::LoopResult> *)this_10);
      *pLVar6 = *(LoopResult *)(puVar4 + 0xe5);
      if (*pLVar6 == CONTINUE_LOOP) {
        *pbVar5 = 0;
LAB_0072a71f:
        local_928 = 0;
      }
      else {
        if (1 < *pLVar6 - BREAK_LOOP_CONN_OK) goto LAB_0072a71f;
        kj::_::
        CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
        ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                        *)this_00,*pLVar6);
        local_928 = 3;
      }
      OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
      ::~OneOf(__return_storage_ptr__);
      Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
      ::~Promise((Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                  *)this_06);
      Promise<bool>::~Promise((Promise<bool> *)this_01);
    } while (local_928 == 0);
    local_8b8 = local_928;
LAB_0072a7f4:
    if (local_8b8 == 3) {
      kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
      bVar2 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar4 + 0x72f));
      if (!bVar2) {
        *puVar4 = 0;
        *(undefined1 *)((long)puVar4 + 0x72c) = 3;
        loop((void *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),pvVar7);
        return (PromiseBase)(PromiseBase)this;
      }
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar4 + 0x72f));
    }
    kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::~Coroutine(this_00);
    if (puVar4 != (undefined8 *)0x0) {
      operator_delete(puVar4,0x730);
    }
  }
  else {
    *(undefined1 *)((long)puVar4 + 0x72c) = 0;
    loop((void *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),pvVar7);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> loop() {
    bool firstRequest = true;

    while (true) {
      if (!firstRequest && server.draining && httpInput.isCleanDrain()) {
        // Don't call awaitNextMessage() in this case because that will initiate a read() which will
        // immediately be canceled, losing data.
        co_return BREAK_LOOP_CONN_OK;
      }

      auto firstByte = httpInput.awaitNextMessage();

      if (!firstRequest) {
        // For requests after the first, require that the first byte arrive before the pipeline
        // timeout, otherwise treat it like the connection was simply closed.
        auto timeoutPromise = server.timer.afterDelay(server.settings.pipelineTimeout);

        if (httpInput.isCleanDrain()) {
          // If we haven't buffered any data, then we can safely drain here, so allow the wait to
          // be canceled by the onDrain promise.
          auto cleanDrainPromise = server.onDrain.addBranch()
              .then([this]() -> kj::Promise<void> {
            // This is a little tricky... drain() has been called, BUT we could have read some data
            // into the buffer in the meantime, and we don't want to lose that. If any data has
            // arrived, then we have no choice but to read the rest of the request and respond to
            // it.
            if (!httpInput.isCleanDrain()) {
              return kj::NEVER_DONE;
            }

            // OK... As far as we know, no data has arrived in the buffer. However, unfortunately,
            // we don't *really* know that, because read() is asynchronous. It may have already
            // delivered some bytes, but we just haven't received the notification yet, because it's
            // still queued on the event loop. As a horrible hack, we use evalLast(), so that any
            // such pending notifications get a chance to be delivered.
            // TODO(someday): Does this actually work on Windows, where the notification could also
            //   be queued on the IOCP?
            return kj::evalLast([this]() -> kj::Promise<void> {
              if (httpInput.isCleanDrain()) {
                return kj::READY_NOW;
              } else {
                return kj::NEVER_DONE;
              }
            });
          });
          timeoutPromise = timeoutPromise.exclusiveJoin(kj::mv(cleanDrainPromise));
        }

        firstByte = firstByte.exclusiveJoin(timeoutPromise.then([this]() -> bool {
          timedOut = true;
          return false;
        }));
      }

      auto receivedHeaders = firstByte
          .then([this,firstRequest](bool hasData)
              -> kj::Promise<HttpHeaders::RequestConnectOrProtocolError> {
        if (hasData) {
          auto readHeaders = httpInput.readRequestHeaders();
          if (!firstRequest) {
            // On requests other than the first, the header timeout starts ticking when we receive
            // the first byte of a pipeline response.
            readHeaders = readHeaders.exclusiveJoin(
                server.timer.afterDelay(server.settings.headerTimeout)
                .then([this]() -> HttpHeaders::RequestConnectOrProtocolError {
              timedOut = true;
              return HttpHeaders::ProtocolError {
                408, "Request Timeout",
                "Timed out waiting for next request headers.", nullptr
              };
            }));
          }
          return kj::mv(readHeaders);
        } else {
          // Client closed connection or pipeline timed out with no bytes received. This is not an
          // error, so don't report one.
          this->closed = true;
          return HttpHeaders::RequestConnectOrProtocolError(HttpHeaders::ProtocolError {
            408, "Request Timeout",
            "Client closed connection or connection timeout "
            "while waiting for request headers.", nullptr
          });
        }
      });

      if (firstRequest) {
        // On the first request, the header timeout starts ticking immediately upon request opening.
        // NOTE: Since we assume that the client wouldn't have formed a connection if they did not
        //   intend to send a request, we immediately treat this connection as having an active
        //   request, i.e. we do NOT cancel it if drain() is called.
        auto timeoutPromise = server.timer.afterDelay(server.settings.headerTimeout)
            .then([this]() -> HttpHeaders::RequestConnectOrProtocolError {
          timedOut = true;
          return HttpHeaders::ProtocolError {
            408, "Request Timeout",
            "Timed out waiting for initial request headers.", nullptr
          };
        });
        receivedHeaders = receivedHeaders.exclusiveJoin(kj::mv(timeoutPromise));
      }

      auto requestOrProtocolError = co_await receivedHeaders;
      auto loopResult = co_await onHeaders(kj::mv(requestOrProtocolError));

      switch (loopResult) {
        case BREAK_LOOP_CONN_ERR:
        case BREAK_LOOP_CONN_OK: co_return loopResult;
        case CONTINUE_LOOP: {
          firstRequest = false;
        }
      }
    }
  }